

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void hexdump(char *p,char *ref,size_t l,size_t offset)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  if (p == (char *)0x0) {
    logprintf("(null)\n");
    return;
  }
  if (l != 0) {
    uVar1 = 0;
    do {
      logprintf("%04x",(ulong)(uint)((int)uVar1 + (int)offset));
      uVar5 = 0x20;
      uVar3 = 0;
      do {
        if (l <= uVar1 + uVar3) break;
        if ((ref != (char *)0x0) && (p[uVar3 + uVar1] != ref[uVar3 + uVar1])) {
          uVar5 = 0x5f;
        }
        logprintf("%c%02x",(ulong)uVar5,(ulong)(byte)p[uVar3 + uVar1]);
        if ((ref != (char *)0x0) && (p[uVar3 + uVar1] == ref[uVar3 + uVar1])) {
          uVar5 = 0x20;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != 0x10);
      uVar2 = (ulong)uVar5;
      if (uVar3 < 0x10) {
        lVar4 = uVar3 - 0x10;
        do {
          logprintf("%c  ",uVar2);
          uVar2 = 0x20;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0);
      }
      logprintf("%c",uVar2);
      lVar4 = 0x10;
      uVar3 = uVar1;
      do {
        if (l <= uVar3) break;
        if ((byte)(p[uVar3] - 0x20U) < 0x5f) {
          logprintf("%c");
        }
        else {
          logprintf(".");
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      logprintf("\n");
      uVar1 = uVar1 + 0x10;
    } while (uVar1 < l);
  }
  return;
}

Assistant:

static void
hexdump(const char *p, const char *ref, size_t l, size_t offset)
{
	size_t i, j;
	char sep;

	if (p == NULL) {
		logprintf("(null)\n");
		return;
	}
	for(i=0; i < l; i+=16) {
		logprintf("%04x", (unsigned)(i + offset));
		sep = ' ';
		for (j = 0; j < 16 && i + j < l; j++) {
			if (ref != NULL && p[i + j] != ref[i + j])
				sep = '_';
			logprintf("%c%02x", sep, 0xff & (int)p[i+j]);
			if (ref != NULL && p[i + j] == ref[i + j])
				sep = ' ';
		}
		for (; j < 16; j++) {
			logprintf("%c  ", sep);
			sep = ' ';
		}
		logprintf("%c", sep);
		for (j=0; j < 16 && i + j < l; j++) {
			int c = p[i + j];
			if (c >= ' ' && c <= 126)
				logprintf("%c", c);
			else
				logprintf(".");
		}
		logprintf("\n");
	}
}